

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O1

string * __thiscall despot::TagState::text_abi_cxx11_(string *__return_storage_ptr__,TagState *this)

{
  size_type *psVar1;
  undefined8 uVar2;
  long *plVar3;
  undefined8 *puVar4;
  long *plVar5;
  ulong *puVar6;
  ulong uVar7;
  ulong *local_a8;
  long local_a0;
  ulong local_98;
  long lStack_90;
  ulong *local_88;
  long local_80;
  ulong local_78 [2];
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  long *local_48 [2];
  long local_38 [2];
  
  if (BaseTag::current_ == 0) {
    to_string<int>(__return_storage_ptr__,*(int *)&this->field_0xc);
    return __return_storage_ptr__;
  }
  despot::Floor::NumCells();
  despot::Floor::GetCell((int)BaseTag::current_ + 0x58);
  despot::Floor::NumCells();
  despot::Floor::GetCell((int)BaseTag::current_ + 0x58);
  to_string<despot::Coord>((Coord)0x73);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x1190a5);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_58 = *plVar5;
    lStack_50 = plVar3[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar5;
    local_68 = (long *)*plVar3;
  }
  local_60 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_68);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_98 = *puVar6;
    lStack_90 = plVar3[3];
    local_a8 = &local_98;
  }
  else {
    local_98 = *puVar6;
    local_a8 = (ulong *)*plVar3;
  }
  local_a0 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  to_string<despot::Coord>((Coord)0x45);
  uVar7 = 0xf;
  if (local_a8 != &local_98) {
    uVar7 = local_98;
  }
  if (uVar7 < (ulong)(local_80 + local_a0)) {
    uVar7 = 0xf;
    if (local_88 != local_78) {
      uVar7 = local_78[0];
    }
    if ((ulong)(local_80 + local_a0) <= uVar7) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_a8);
      goto LAB_0010dba2;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_88);
LAB_0010dba2:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    uVar2 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string TagState::text() const {
	// NOTE: This will fail if several Tag instances are running
	if (BaseTag::current_ != NULL) {
		int rob = BaseTag::current_->StateIndexToRobIndex(state_id);
		Coord rob_pos = BaseTag::current_->floor_.GetCell(rob);
		int opp = BaseTag::current_->StateIndexToOppIndex(state_id);
		Coord opp_pos = BaseTag::current_->floor_.GetCell(opp);
		return "Rob at " + to_string(rob_pos) + ", Opp at " + to_string(opp_pos);
	} else
		return to_string(state_id);
}